

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_dcbf(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 EA;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  gen_set_access_type(ctx,0x60);
  EA = tcg_temp_new_i64(tcg_ctx);
  gen_addr_reg_index(ctx,EA);
  gen_qemu_ld8u(ctx,EA,EA);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_dcbf(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    /* XXX: specification says this is treated as a load by the MMU */
    TCGv t0;
    gen_set_access_type(ctx, ACCESS_CACHE);
    t0 = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, t0);
    gen_qemu_ld8u(ctx, t0, t0);
    tcg_temp_free(tcg_ctx, t0);
}